

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRampFlightType::IfcRampFlightType(IfcRampFlightType *this)

{
  IfcRampFlightType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c0,"IfcRampFlightType");
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__00f768d0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>,
             &PTR_construction_vtable_24__00f76a08);
  *(undefined8 *)this = 0xf767a0;
  *(undefined8 *)&this->field_0x1c0 = 0xf768b8;
  *(undefined8 *)&this->field_0x88 = 0xf767c8;
  *(undefined8 *)&this->field_0x98 = 0xf767f0;
  *(undefined8 *)&this->field_0xf0 = 0xf76818;
  *(undefined8 *)&this->field_0x148 = 0xf76840;
  *(undefined8 *)&this->field_0x180 = 0xf76868;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xf76890;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRampFlightType,_1UL>).field_0x10
            );
  return;
}

Assistant:

IfcRampFlightType() : Object("IfcRampFlightType") {}